

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.c
# Opt level: O0

int emit_move(Function *fn,Pseudo *src,Pseudo *dst)

{
  _Bool _Var1;
  Pseudo *dst_local;
  Pseudo *src_local;
  Function *fn_local;
  
  if (((undefined1  [48])*dst & (undefined1  [48])0xf) == (undefined1  [48])0x1) {
    emit_move_flttemp(fn,src,dst);
  }
  else if ((((undefined1  [48])*dst & (undefined1  [48])0xf) == (undefined1  [48])0x2) ||
          (((undefined1  [48])*dst & (undefined1  [48])0xf) == (undefined1  [48])0x3)) {
    emit_move_inttemp(fn,src,dst);
  }
  else {
    if (((((undefined1  [48])*dst & (undefined1  [48])0xf) != (undefined1  [48])0x4) &&
        (((undefined1  [48])*dst & (undefined1  [48])0xf) != (undefined1  [48])0x0)) &&
       (((undefined1  [48])*dst & (undefined1  [48])0xf) != (undefined1  [48])0xd)) {
      handle_error_bad_pseudo(fn,dst,"emit_move: Unexpected dst pseudo");
      return -1;
    }
    if (((((undefined1  [48])*src & (undefined1  [48])0xf) == (undefined1  [48])0xd) ||
        (((undefined1  [48])*src & (undefined1  [48])0xf) == (undefined1  [48])0x4)) ||
       ((((undefined1  [48])*src & (undefined1  [48])0xf) == (undefined1  [48])0x0 ||
        (((undefined1  [48])*src & (undefined1  [48])0xf) == (undefined1  [48])0xc)))) {
      _Var1 = refers_to_same_register(fn,src,dst);
      if (!_Var1) {
        raviX_buffer_add_string(&fn->body,"{\n const TValue *src_reg = ");
        emit_reg_accessor(fn,src,0);
        raviX_buffer_add_string(&fn->body,";\n TValue *dst_reg = ");
        emit_reg_accessor(fn,dst,0);
        raviX_buffer_add_string
                  (&fn->body,
                   ";\n dst_reg->tt_ = src_reg->tt_;\n dst_reg->value_.n = src_reg->value_.n;\n}\n")
        ;
      }
    }
    else if (((undefined1  [48])*src & (undefined1  [48])0xf) == (undefined1  [48])0x2) {
      raviX_buffer_add_string(&fn->body,"{\n TValue *dst_reg = ");
      emit_reg_accessor(fn,dst,0);
      raviX_buffer_add_string(&fn->body,";\n setivalue(dst_reg, ");
      emit_varname(fn,src);
      raviX_buffer_add_string(&fn->body,");\n}\n");
    }
    else if (((undefined1  [48])*src & (undefined1  [48])0xf) == (undefined1  [48])0x1) {
      raviX_buffer_add_string(&fn->body,"{\n TValue *dst_reg = ");
      emit_reg_accessor(fn,dst,0);
      raviX_buffer_add_string(&fn->body,";\n setfltvalue(dst_reg, ");
      emit_varname(fn,src);
      raviX_buffer_add_string(&fn->body,");\n}\n");
    }
    else if ((((undefined1  [48])*src & (undefined1  [48])0xf) == (undefined1  [48])0x8) ||
            (((undefined1  [48])*src & (undefined1  [48])0xf) == (undefined1  [48])0x9)) {
      raviX_buffer_add_string(&fn->body,"{\n TValue *dst_reg = ");
      emit_reg_accessor(fn,dst,0);
      raviX_buffer_add_fstring
                (&fn->body,";\n setbvalue(dst_reg, %d);\n}\n",
                 (ulong)(((undefined1  [48])*src & (undefined1  [48])0xf) == (undefined1  [48])0x8))
      ;
    }
    else if (((undefined1  [48])*src & (undefined1  [48])0xf) == (undefined1  [48])0x3) {
      raviX_buffer_add_string(&fn->body,"{\n TValue *dst_reg = ");
      emit_reg_accessor(fn,dst,0);
      raviX_buffer_add_string(&fn->body,";\n setbvalue(dst_reg, ");
      emit_varname(fn,src);
      raviX_buffer_add_string(&fn->body,");\n}\n");
    }
    else if (((undefined1  [48])*src & (undefined1  [48])0xf) == (undefined1  [48])0x7) {
      raviX_buffer_add_string(&fn->body,"{\n TValue *dst_reg = ");
      emit_reg_accessor(fn,dst,0);
      raviX_buffer_add_string(&fn->body,";\n setnilvalue(dst_reg);\n}\n");
    }
    else {
      if (((undefined1  [48])*src & (undefined1  [48])0xf) != (undefined1  [48])0x5) {
        handle_error_bad_pseudo(fn,src,"emit_move: Unexpected src pseudo");
        return -1;
      }
      raviX_buffer_add_string(&fn->body,"{\n TValue *dst_reg = ");
      emit_reg_accessor(fn,dst,0);
      raviX_buffer_add_string(&fn->body,";\n");
      if (((src->field_3).constant)->type == 8) {
        raviX_buffer_add_fstring
                  (&fn->body," setivalue(dst_reg, %lld);\n",((src->field_3).proc)->nodes);
      }
      else if (((src->field_3).constant)->type == 0x10) {
        raviX_buffer_add_string(&fn->body," setfltvalue(dst_reg, ");
        raviX_buffer_add_double(&fn->body,(((src->field_3).constant)->field_2).n);
        raviX_buffer_add_string(&fn->body," );\n");
      }
      else if (((src->field_3).constant)->type == 7) {
        raviX_buffer_add_fstring
                  (&fn->body," setbvalue(dst_reg, %i);\n",
                   (ulong)((src->field_3).proc)->nodes & 0xffffffff);
      }
      else if (((src->field_3).constant)->type == 1) {
        raviX_buffer_add_string(&fn->body," setnilvalue(dst_reg);\n");
      }
      else {
        if (((src->field_3).constant)->type != 0x101) {
          handle_error_bad_pseudo(fn,src,"emit_move: Unexpected src pseudo");
          return -1;
        }
        raviX_buffer_add_string(&fn->body," TValue *src_reg = ");
        emit_reg_accessor(fn,src,0);
        raviX_buffer_add_string(&fn->body,";\n");
        raviX_buffer_add_string
                  (&fn->body,
                   " dst_reg->tt_ = src_reg->tt_;\n dst_reg->value_.gc = src_reg->value_.gc;\n");
      }
      raviX_buffer_add_string(&fn->body,"}\n");
    }
  }
  return 0;
}

Assistant:

static int emit_move(Function *fn, Pseudo *src, Pseudo *dst)
{
	if (dst->type == PSEUDO_TEMP_FLT) {
		emit_move_flttemp(fn, src, dst);
	} else if (dst->type == PSEUDO_TEMP_INT || dst->type == PSEUDO_TEMP_BOOL) {
		emit_move_inttemp(fn, src, dst);
	} else if (dst->type == PSEUDO_TEMP_ANY || dst->type == PSEUDO_SYMBOL || dst->type == PSEUDO_LUASTACK) {
		if (src->type == PSEUDO_LUASTACK || src->type == PSEUDO_TEMP_ANY || src->type == PSEUDO_SYMBOL ||
		    src->type == PSEUDO_RANGE_SELECT) {
			// Only emit a move if we are not referencing the same register
			if (!refers_to_same_register(fn, src, dst)) {
				raviX_buffer_add_string(&fn->body, "{\n const TValue *src_reg = ");
				emit_reg_accessor(fn, src, 0);
				raviX_buffer_add_string(&fn->body, ";\n TValue *dst_reg = ");
				emit_reg_accessor(fn, dst, 0);
				// FIXME - check value assignment approach
				raviX_buffer_add_string(
				    &fn->body,
				    ";\n dst_reg->tt_ = src_reg->tt_;\n dst_reg->value_.n = src_reg->value_.n;\n}\n");
			}
		} else if (src->type == PSEUDO_TEMP_INT) {
			raviX_buffer_add_string(&fn->body, "{\n TValue *dst_reg = ");
			emit_reg_accessor(fn, dst, 0);
			raviX_buffer_add_string(&fn->body, ";\n setivalue(dst_reg, ");
			emit_varname(fn, src);
			raviX_buffer_add_string(&fn->body, ");\n}\n");
		} else if (src->type == PSEUDO_TEMP_FLT) {
			raviX_buffer_add_string(&fn->body, "{\n TValue *dst_reg = ");
			emit_reg_accessor(fn, dst, 0);
			raviX_buffer_add_string(&fn->body, ";\n setfltvalue(dst_reg, ");
			emit_varname(fn, src);
			raviX_buffer_add_string(&fn->body, ");\n}\n");
		} else if (src->type == PSEUDO_TRUE || src->type == PSEUDO_FALSE) {
			raviX_buffer_add_string(&fn->body, "{\n TValue *dst_reg = ");
			emit_reg_accessor(fn, dst, 0);
			raviX_buffer_add_fstring(&fn->body, ";\n setbvalue(dst_reg, %d);\n}\n",
						 src->type == PSEUDO_TRUE ? 1 : 0);
		} else if (src->type == PSEUDO_TEMP_BOOL) {
			raviX_buffer_add_string(&fn->body, "{\n TValue *dst_reg = ");
			emit_reg_accessor(fn, dst, 0);
			raviX_buffer_add_string(&fn->body, ";\n setbvalue(dst_reg, ");
			emit_varname(fn, src);
			raviX_buffer_add_string(&fn->body, ");\n}\n");
		} else if (src->type == PSEUDO_NIL) {
			raviX_buffer_add_string(&fn->body, "{\n TValue *dst_reg = ");
			emit_reg_accessor(fn, dst, 0);
			raviX_buffer_add_string(&fn->body, ";\n setnilvalue(dst_reg);\n}\n");
		} else if (src->type == PSEUDO_CONSTANT) {
			raviX_buffer_add_string(&fn->body, "{\n TValue *dst_reg = ");
			emit_reg_accessor(fn, dst, 0);
			raviX_buffer_add_string(&fn->body, ";\n");
			if (src->constant->type == RAVI_TNUMINT) {
				raviX_buffer_add_fstring(&fn->body, " setivalue(dst_reg, %lld);\n", src->constant->i);
			} else if (src->constant->type == RAVI_TNUMFLT) {
				raviX_buffer_add_string(&fn->body, " setfltvalue(dst_reg, ");
				raviX_buffer_add_double(&fn->body, src->constant->n);
				raviX_buffer_add_string(&fn->body, " );\n");
			} else if (src->constant->type == RAVI_TBOOLEAN) {
				raviX_buffer_add_fstring(&fn->body, " setbvalue(dst_reg, %i);\n",
							 (int)src->constant->i);
			} else if (src->constant->type == RAVI_TNIL) {
				raviX_buffer_add_string(&fn->body, " setnilvalue(dst_reg);\n");
			} else if (src->constant->type == RAVI_TSTRING) {
				raviX_buffer_add_string(&fn->body, " TValue *src_reg = ");
				emit_reg_accessor(fn, src, 0);
				raviX_buffer_add_string(&fn->body, ";\n");
				raviX_buffer_add_string(
				    &fn->body,
				    " dst_reg->tt_ = src_reg->tt_;\n dst_reg->value_.gc = src_reg->value_.gc;\n");
			} else {
				handle_error_bad_pseudo(fn, src, "emit_move: Unexpected src pseudo");
				return -1;
			}
			raviX_buffer_add_string(&fn->body, "}\n");
		} else {
			/* range pseudos not supported yet */
			handle_error_bad_pseudo(fn, src, "emit_move: Unexpected src pseudo");
			return -1;
		}
	} else {
		handle_error_bad_pseudo(fn, dst, "emit_move: Unexpected dst pseudo");
		return -1;
	}
	return 0;
}